

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void deqp::gles3::Functional::checkColorFormatSupport(Context *context,deUint32 sizedFormat)

{
  char *__rhs;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  istream *piVar3;
  NotSupportedError *this;
  pointer pbVar4;
  long lVar5;
  allocator<char> local_249;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExts;
  string errMsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream extensions;
  
  requiredExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  requiredExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  requiredExts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  switch(sizedFormat) {
  case 0x822d:
  case 0x822f:
switchD_0112b2f3_caseD_822d:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensions,"GL_EXT_color_buffer_half_float",(allocator<char> *)&errMsg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&requiredExts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensions);
    std::__cxx11::string::~string((string *)&extensions);
  case 0x822e:
  case 0x8230:
switchD_0112b2f3_caseD_822e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensions,"GL_EXT_color_buffer_float",(allocator<char> *)&errMsg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&requiredExts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensions);
    break;
  default:
    if (sizedFormat - 0x8814 < 2) goto switchD_0112b2f3_caseD_822e;
    if (sizedFormat == 0x881a) goto switchD_0112b2f3_caseD_822d;
    if (sizedFormat == 0x8c3a) goto switchD_0112b2f3_caseD_822e;
    if (sizedFormat != 0x881b) goto LAB_0112b365;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extensions,"GL_EXT_color_buffer_half_float",(allocator<char> *)&errMsg);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&requiredExts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&extensions);
  }
  std::__cxx11::string::~string((string *)&extensions);
LAB_0112b365:
  if (requiredExts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      requiredExts.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
LAB_0112b444:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&requiredExts);
    return;
  }
  pbVar4 = requiredExts.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pbVar4 == requiredExts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      lVar5 = (long)requiredExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)requiredExts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x20) {
        std::__cxx11::string::string
                  ((string *)&local_210,
                   (string *)
                   requiredExts.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>(local_1f0,", ",&local_249);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&extensions);
        for (pbVar4 = requiredExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pbVar4 != requiredExts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pbVar4 = pbVar4 + 1) {
          if (pbVar4 != requiredExts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
            std::operator<<((ostream *)&extensions,local_1f0);
          }
          std::operator<<((ostream *)&extensions,(string *)pbVar4);
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&extensions);
        std::operator+(&local_210," one of the following: ",&local_1d0);
      }
      std::operator+(&errMsg,"Format not supported, requires ",&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (lVar5 != 0x20) {
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string(local_1f0);
      }
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError(this,&errMsg);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    __rhs = (pbVar4->_M_dataplus)._M_p;
    iVar2 = (*context->_vptr_Context[0x7c])(context,0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&errMsg,(char *)CONCAT44(extraout_var,iVar2),(allocator<char> *)&local_210)
    ;
    std::__cxx11::istringstream::istringstream((istringstream *)&extensions,(string *)&errMsg,_S_in)
    ;
    std::__cxx11::string::~string((string *)&errMsg);
    errMsg._M_dataplus._M_p = (pointer)&errMsg.field_2;
    errMsg._M_string_length = 0;
    errMsg.field_2._M_local_buf[0] = '\0';
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&extensions,(string *)&errMsg,' '),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      bVar1 = std::operator==(&errMsg,__rhs);
      if (bVar1) {
        std::__cxx11::string::~string((string *)&errMsg);
        std::__cxx11::istringstream::~istringstream((istringstream *)&extensions);
        goto LAB_0112b444;
      }
    }
    std::__cxx11::string::~string((string *)&errMsg);
    std::__cxx11::istringstream::~istringstream((istringstream *)&extensions);
    pbVar4 = pbVar4 + 1;
  } while( true );
}

Assistant:

static void checkColorFormatSupport (sglr::Context& context, deUint32 sizedFormat)
{
	const std::vector<std::string> requiredExts = getEnablingExtensions(sizedFormat);

	if (!isAnyExtensionSupported(context, requiredExts))
	{
		std::string	errMsg	= "Format not supported, requires "
							+ ((requiredExts.size() == 1) ? requiredExts[0] : " one of the following: " + join(requiredExts, ", "));

		throw tcu::NotSupportedError(errMsg);
	}
}